

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

string * __thiscall
pbrt::syntactic::Material::toString_abi_cxx11_(string *__return_storage_ptr__,Material *this)

{
  char cVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Self __tmp;
  _Rb_tree_header *p_Var4;
  stringstream ss;
  char *local_1d8;
  long local_1d0;
  char local_1c8 [16];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Material type=\'",0xf);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->type)._M_dataplus._M_p,
                      (this->type)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' {",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  p_Var3 = (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," - ",3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
      (**(code **)(**(long **)(p_Var3 + 2) + 0x10))(&local_1d8);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1d8,local_1d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  cVar1 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Material::toString() const
    {
      std::stringstream ss;
      ss << "Material type='"<< type << "' {" << std::endl;
      for (std::map<std::string,std::shared_ptr<Param> >::const_iterator it=param.begin(); 
           it != param.end(); it++) {
        ss << " - " << it->first << " : " << it->second->toString() << std::endl;
      }
      ss << "}" << std::endl;
      return ss.str();
    }